

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O1

void __thiscall
QConcatenateTablesProxyModel::addSourceModel
          (QConcatenateTablesProxyModel *this,QAbstractItemModel *sourceModel)

{
  QConcatenateTablesProxyModelPrivate *this_00;
  QObject *pQVar1;
  Entry *pEVar2;
  piter pVar3;
  QAbstractItemModel *pQVar4;
  int iVar5;
  QSlotObjectBase *pQVar6;
  Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *pDVar7;
  ulong uVar8;
  long lVar9;
  long in_FS_OFFSET;
  piter pVar10;
  QAbstractItemModel *sourceModel_local;
  QKeyValueRange<const_QHash<int,_QByteArray>_&> local_e0;
  undefined8 local_d8;
  QHash<int,_QByteArray> newRoleNames;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  QObject local_40;
  
  local_40.d_ptr.d = *(QObjectData **)(in_FS_OFFSET + 0x28);
  this_00 = *(QConcatenateTablesProxyModelPrivate **)(this + 8);
  local_c0._0_8_ = (_func_int **)0xffffffffffffffff;
  local_c0._8_8_ = (QObjectData *)0x0;
  auStack_b0._0_8_ = (QAbstractItemModel *)0x0;
  sourceModel_local = sourceModel;
  iVar5 = (*(sourceModel->super_QObject)._vptr_QObject[0xf])(sourceModel,local_c0);
  if (0 < iVar5) {
    local_c0._0_8_ = (_func_int **)0xffffffffffffffff;
    local_c0._8_8_ = (QObjectData *)0x0;
    auStack_b0._0_8_ = (QAbstractItemModel *)0x0;
    QAbstractItemModel::beginInsertRows
              ((QAbstractItemModel *)this,(QModelIndex *)local_c0,this_00->m_rowCount,
               iVar5 + -1 + this_00->m_rowCount);
  }
  pQVar4 = sourceModel_local;
  this_00->m_rowCount = this_00->m_rowCount + iVar5;
  newRoleNames.d = (Data *)QAbstractItemModel::dataChanged;
  local_e0.super_QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)
       QConcatenateTablesProxyModelPrivate::slotDataChanged;
  local_d8 = 0;
  pQVar1 = (this_00->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar6->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar6->m_impl =
       QtPrivate::
       QPrivateSlotObject<void_(QConcatenateTablesProxyModelPrivate::*)(const_QModelIndex_&,_const_QModelIndex_&,_const_QList<int>_&),_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&,_const_QList<int>_&>,_void>
       ::impl;
  *(code **)(pQVar6 + 1) = QConcatenateTablesProxyModelPrivate::slotDataChanged;
  pQVar6[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            ((QObject *)local_c0,&pQVar4->super_QObject,&newRoleNames.d,pQVar1,(void **)&local_e0,
             pQVar6,AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
  pQVar4 = sourceModel_local;
  newRoleNames.d = (Data *)QAbstractItemModel::rowsInserted;
  local_e0.super_QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)
       QConcatenateTablesProxyModelPrivate::slotRowsInserted;
  local_d8 = 0;
  pQVar1 = (this_00->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar6->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar6->m_impl =
       QtPrivate::
       QPrivateSlotObject<void_(QConcatenateTablesProxyModelPrivate::*)(const_QModelIndex_&,_int,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
       ::impl;
  *(code **)(pQVar6 + 1) = QConcatenateTablesProxyModelPrivate::slotRowsInserted;
  pQVar6[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            ((QObject *)(local_c0 + 8),&pQVar4->super_QObject,&newRoleNames.d,pQVar1,
             (void **)&local_e0,pQVar6,AutoConnection,(int *)0x0,
             &QAbstractItemModel::staticMetaObject);
  pQVar4 = sourceModel_local;
  newRoleNames.d = (Data *)QAbstractItemModel::rowsRemoved;
  local_e0.super_QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)
       QConcatenateTablesProxyModelPrivate::slotRowsRemoved;
  local_d8 = 0;
  pQVar1 = (this_00->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar6->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar6->m_impl =
       QtPrivate::
       QPrivateSlotObject<void_(QConcatenateTablesProxyModelPrivate::*)(const_QModelIndex_&,_int,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
       ::impl;
  *(code **)(pQVar6 + 1) = QConcatenateTablesProxyModelPrivate::slotRowsRemoved;
  pQVar6[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            ((QObject *)auStack_b0,&pQVar4->super_QObject,&newRoleNames.d,pQVar1,(void **)&local_e0,
             pQVar6,AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
  pQVar4 = sourceModel_local;
  newRoleNames.d = (Data *)QAbstractItemModel::rowsAboutToBeInserted;
  local_e0.super_QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)
       QConcatenateTablesProxyModelPrivate::slotRowsAboutToBeInserted;
  local_d8 = 0;
  pQVar1 = (this_00->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar6->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar6->m_impl =
       QtPrivate::
       QPrivateSlotObject<void_(QConcatenateTablesProxyModelPrivate::*)(const_QModelIndex_&,_int,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
       ::impl;
  *(code **)(pQVar6 + 1) = QConcatenateTablesProxyModelPrivate::slotRowsAboutToBeInserted;
  pQVar6[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            ((QObject *)(auStack_b0 + 8),&pQVar4->super_QObject,&newRoleNames.d,pQVar1,
             (void **)&local_e0,pQVar6,AutoConnection,(int *)0x0,
             &QAbstractItemModel::staticMetaObject);
  pQVar4 = sourceModel_local;
  newRoleNames.d = (Data *)QAbstractItemModel::rowsAboutToBeRemoved;
  local_e0.super_QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)
       QConcatenateTablesProxyModelPrivate::slotRowsAboutToBeRemoved;
  local_d8 = 0;
  pQVar1 = (this_00->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar6->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar6->m_impl =
       QtPrivate::
       QPrivateSlotObject<void_(QConcatenateTablesProxyModelPrivate::*)(const_QModelIndex_&,_int,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
       ::impl;
  *(code **)(pQVar6 + 1) = QConcatenateTablesProxyModelPrivate::slotRowsAboutToBeRemoved;
  pQVar6[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            ((QObject *)local_a0,&pQVar4->super_QObject,&newRoleNames.d,pQVar1,(void **)&local_e0,
             pQVar6,AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
  pQVar4 = sourceModel_local;
  newRoleNames.d = (Data *)QAbstractItemModel::rowsMoved;
  local_e0.super_QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)
       QConcatenateTablesProxyModelPrivate::slotRowsMoved;
  local_d8 = 0;
  pQVar1 = (this_00->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar6->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar6->m_impl =
       QtPrivate::
       QPrivateSlotObject<void_(QConcatenateTablesProxyModelPrivate::*)(const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int>,_void>
       ::impl;
  *(code **)(pQVar6 + 1) = QConcatenateTablesProxyModelPrivate::slotRowsMoved;
  pQVar6[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            ((QObject *)(local_a0 + 8),&pQVar4->super_QObject,&newRoleNames.d,pQVar1,
             (void **)&local_e0,pQVar6,AutoConnection,(int *)0x0,
             &QAbstractItemModel::staticMetaObject);
  pQVar4 = sourceModel_local;
  newRoleNames.d = (Data *)QAbstractItemModel::rowsAboutToBeMoved;
  local_e0.super_QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)
       QConcatenateTablesProxyModelPrivate::slotRowsAboutToBeMoved;
  local_d8 = 0;
  pQVar1 = (this_00->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar6->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar6->m_impl =
       QtPrivate::
       QPrivateSlotObject<void_(QConcatenateTablesProxyModelPrivate::*)(const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int>,_void>
       ::impl;
  *(code **)(pQVar6 + 1) = QConcatenateTablesProxyModelPrivate::slotRowsAboutToBeMoved;
  pQVar6[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            ((QObject *)local_90,&pQVar4->super_QObject,&newRoleNames.d,pQVar1,(void **)&local_e0,
             pQVar6,AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
  pQVar4 = sourceModel_local;
  newRoleNames.d = (Data *)QAbstractItemModel::columnsInserted;
  local_e0.super_QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)
       QConcatenateTablesProxyModelPrivate::slotColumnsInserted;
  local_d8 = 0;
  pQVar1 = (this_00->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar6->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar6->m_impl =
       QtPrivate::
       QPrivateSlotObject<void_(QConcatenateTablesProxyModelPrivate::*)(const_QModelIndex_&,_int,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
       ::impl;
  *(code **)(pQVar6 + 1) = QConcatenateTablesProxyModelPrivate::slotColumnsInserted;
  pQVar6[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            ((QObject *)(local_90 + 8),&pQVar4->super_QObject,&newRoleNames.d,pQVar1,
             (void **)&local_e0,pQVar6,AutoConnection,(int *)0x0,
             &QAbstractItemModel::staticMetaObject);
  pQVar4 = sourceModel_local;
  newRoleNames.d = (Data *)QAbstractItemModel::columnsRemoved;
  local_e0.super_QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)
       QConcatenateTablesProxyModelPrivate::slotColumnsRemoved;
  local_d8 = 0;
  pQVar1 = (this_00->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar6->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar6->m_impl =
       QtPrivate::
       QPrivateSlotObject<void_(QConcatenateTablesProxyModelPrivate::*)(const_QModelIndex_&,_int,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
       ::impl;
  *(code **)(pQVar6 + 1) = QConcatenateTablesProxyModelPrivate::slotColumnsRemoved;
  pQVar6[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            ((QObject *)local_80,&pQVar4->super_QObject,&newRoleNames.d,pQVar1,(void **)&local_e0,
             pQVar6,AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
  pQVar4 = sourceModel_local;
  newRoleNames.d = (Data *)QAbstractItemModel::columnsAboutToBeInserted;
  local_e0.super_QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)
       QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeInserted;
  local_d8 = 0;
  pQVar1 = (this_00->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar6->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar6->m_impl =
       QtPrivate::
       QPrivateSlotObject<void_(QConcatenateTablesProxyModelPrivate::*)(const_QModelIndex_&,_int,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
       ::impl;
  *(code **)(pQVar6 + 1) = QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeInserted;
  pQVar6[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            ((QObject *)(local_80 + 8),&pQVar4->super_QObject,&newRoleNames.d,pQVar1,
             (void **)&local_e0,pQVar6,AutoConnection,(int *)0x0,
             &QAbstractItemModel::staticMetaObject);
  pQVar4 = sourceModel_local;
  newRoleNames.d = (Data *)QAbstractItemModel::columnsAboutToBeRemoved;
  local_e0.super_QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)
       QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeRemoved;
  local_d8 = 0;
  pQVar1 = (this_00->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar6->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar6->m_impl =
       QtPrivate::
       QPrivateSlotObject<void_(QConcatenateTablesProxyModelPrivate::*)(const_QModelIndex_&,_int,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
       ::impl;
  *(code **)(pQVar6 + 1) = QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeRemoved;
  pQVar6[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            ((QObject *)local_70,&pQVar4->super_QObject,&newRoleNames.d,pQVar1,(void **)&local_e0,
             pQVar6,AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
  pQVar4 = sourceModel_local;
  newRoleNames.d = (Data *)QAbstractItemModel::columnsMoved;
  local_e0.super_QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)
       QConcatenateTablesProxyModelPrivate::slotColumnsMoved;
  local_d8 = 0;
  pQVar1 = (this_00->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar6->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar6->m_impl =
       QtPrivate::
       QPrivateSlotObject<void_(QConcatenateTablesProxyModelPrivate::*)(const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int>,_void>
       ::impl;
  *(code **)(pQVar6 + 1) = QConcatenateTablesProxyModelPrivate::slotColumnsMoved;
  pQVar6[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            ((QObject *)(local_70 + 8),&pQVar4->super_QObject,&newRoleNames.d,pQVar1,
             (void **)&local_e0,pQVar6,AutoConnection,(int *)0x0,
             &QAbstractItemModel::staticMetaObject);
  pQVar4 = sourceModel_local;
  newRoleNames.d = (Data *)QAbstractItemModel::columnsAboutToBeMoved;
  local_e0.super_QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)
       QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeMoved;
  local_d8 = 0;
  pQVar1 = (this_00->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar6->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar6->m_impl =
       QtPrivate::
       QPrivateSlotObject<void_(QConcatenateTablesProxyModelPrivate::*)(const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int>,_void>
       ::impl;
  *(code **)(pQVar6 + 1) = QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeMoved;
  pQVar6[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            ((QObject *)local_60,&pQVar4->super_QObject,&newRoleNames.d,pQVar1,(void **)&local_e0,
             pQVar6,AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
  pQVar4 = sourceModel_local;
  newRoleNames.d = (Data *)QAbstractItemModel::layoutAboutToBeChanged;
  local_e0.super_QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)
       QConcatenateTablesProxyModelPrivate::slotSourceLayoutAboutToBeChanged;
  local_d8 = 0;
  pQVar1 = (this_00->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar6->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar6->m_impl =
       QtPrivate::
       QPrivateSlotObject<void_(QConcatenateTablesProxyModelPrivate::*)(const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint),_QtPrivate::List<const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint>,_void>
       ::impl;
  *(code **)(pQVar6 + 1) = QConcatenateTablesProxyModelPrivate::slotSourceLayoutAboutToBeChanged;
  pQVar6[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            ((QObject *)(local_60 + 8),&pQVar4->super_QObject,&newRoleNames.d,pQVar1,
             (void **)&local_e0,pQVar6,AutoConnection,(int *)0x0,
             &QAbstractItemModel::staticMetaObject);
  pQVar4 = sourceModel_local;
  newRoleNames.d = (Data *)QAbstractItemModel::layoutChanged;
  local_e0.super_QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)
       QConcatenateTablesProxyModelPrivate::slotSourceLayoutChanged;
  local_d8 = 0;
  pQVar1 = (this_00->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar6->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar6->m_impl =
       QtPrivate::
       QPrivateSlotObject<void_(QConcatenateTablesProxyModelPrivate::*)(const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint),_QtPrivate::List<const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint>,_void>
       ::impl;
  *(code **)(pQVar6 + 1) = QConcatenateTablesProxyModelPrivate::slotSourceLayoutChanged;
  pQVar6[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            ((QObject *)local_50,&pQVar4->super_QObject,&newRoleNames.d,pQVar1,(void **)&local_e0,
             pQVar6,AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
  pQVar4 = sourceModel_local;
  newRoleNames.d = (Data *)QAbstractItemModel::modelAboutToBeReset;
  local_e0.super_QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)
       QConcatenateTablesProxyModelPrivate::slotModelAboutToBeReset;
  local_d8 = 0;
  pQVar1 = (this_00->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar6->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar6->m_impl =
       QtPrivate::
       QPrivateSlotObject<void_(QConcatenateTablesProxyModelPrivate::*)(),_QtPrivate::List<>,_void>
       ::impl;
  *(code **)(pQVar6 + 1) = QConcatenateTablesProxyModelPrivate::slotModelAboutToBeReset;
  pQVar6[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            ((QObject *)(local_50 + 8),&pQVar4->super_QObject,&newRoleNames.d,pQVar1,
             (void **)&local_e0,pQVar6,AutoConnection,(int *)0x0,
             &QAbstractItemModel::staticMetaObject);
  pQVar4 = sourceModel_local;
  newRoleNames.d = (Data *)QAbstractItemModel::modelReset;
  local_e0.super_QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>.m_map =
       (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)
       QConcatenateTablesProxyModelPrivate::slotModelReset;
  local_d8 = 0;
  pQVar1 = (this_00->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  pQVar6 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar6->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar6->m_impl =
       QtPrivate::
       QPrivateSlotObject<void_(QConcatenateTablesProxyModelPrivate::*)(),_QtPrivate::List<>,_void>
       ::impl;
  *(code **)(pQVar6 + 1) = QConcatenateTablesProxyModelPrivate::slotModelReset;
  pQVar6[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            (&local_40,&pQVar4->super_QObject,&newRoleNames.d,pQVar1,(void **)&local_e0,pQVar6,
             AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
  QtPrivate::QGenericArrayOps<QConcatenateTablesProxyModelPrivate::ModelInfo>::
  emplace<QAbstractItemModel*&,std::array<QMetaObject::Connection,17ul>>
            ((QGenericArrayOps<QConcatenateTablesProxyModelPrivate::ModelInfo> *)&this_00->m_models,
             (this_00->m_models).d.size,&sourceModel_local,
             (array<QMetaObject::Connection,_17UL> *)local_c0);
  QList<QConcatenateTablesProxyModelPrivate::ModelInfo>::end(&this_00->m_models);
  lVar9 = 0x80;
  do {
    QMetaObject::Connection::~Connection((Connection *)(local_c0 + lVar9));
    lVar9 = lVar9 + -8;
  } while (lVar9 != -8);
  if ((this_00->field_0x104 & 1) == 0) {
    newRoleNames.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (*(sourceModel_local->super_QObject)._vptr_QObject[0x2c])(&newRoleNames);
    local_e0.super_QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>.m_map =
         (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)
         (QKeyValueRangeStorage<const_QHash<int,_QByteArray>_&>)&newRoleNames;
    pVar10 = (piter)QtPrivate::QKeyValueRange<const_QHash<int,_QByteArray>_&>::begin(&local_e0);
    if (pVar10.d != (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)0x0 || pVar10.bucket != 0)
    {
      do {
        uVar8 = pVar10.bucket;
        pDVar7 = pVar10.d;
        pEVar2 = pDVar7->spans[uVar8 >> 7].entries;
        lVar9 = (ulong)pDVar7->spans[uVar8 >> 7].offsets[(uint)pVar10.bucket & 0x7f] * 0x20;
        QHash<int,QByteArray>::insertOrAssign_impl<int_const&,QByteArray_const&>
                  ((TryEmplaceResult *)local_c0,(QHash<int,QByteArray> *)&this_00->m_roleNames,
                   (int *)((pEVar2->storage).data + lVar9),
                   (QByteArray *)((pEVar2->storage).data + lVar9 + 8));
        do {
          if (pDVar7->numBuckets - 1 == uVar8) {
            uVar8 = 0;
            pDVar7 = (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)0x0;
            break;
          }
          uVar8 = uVar8 + 1;
        } while (pDVar7->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
        pVar3.bucket = uVar8;
        pVar3.d = pDVar7;
        pVar10.bucket = uVar8;
        pVar10.d = pDVar7;
      } while ((pDVar7 != (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)0x0) ||
              (pVar10 = pVar3, uVar8 != 0));
    }
    QHash<int,_QByteArray>::~QHash(&newRoleNames);
  }
  if (0 < iVar5) {
    QAbstractItemModel::endInsertRows((QAbstractItemModel *)this);
  }
  QConcatenateTablesProxyModelPrivate::updateColumnCount(this_00);
  if (*(QObjectData **)(in_FS_OFFSET + 0x28) != local_40.d_ptr.d) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QConcatenateTablesProxyModel::addSourceModel(QAbstractItemModel *sourceModel)
{
    Q_D(QConcatenateTablesProxyModel);
    Q_ASSERT(sourceModel);
    Q_ASSERT(!d->containsSourceModel(sourceModel));

    const int newRows = sourceModel->rowCount();
    if (newRows > 0)
        beginInsertRows(QModelIndex(), d->m_rowCount, d->m_rowCount + newRows - 1);
    d->m_rowCount += newRows;
    d->m_models.emplace_back(sourceModel, std::array{
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::dataChanged,
                                d, &QConcatenateTablesProxyModelPrivate::slotDataChanged),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::rowsInserted,
                                d, &QConcatenateTablesProxyModelPrivate::slotRowsInserted),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::rowsRemoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotRowsRemoved),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::rowsAboutToBeInserted,
                                d, &QConcatenateTablesProxyModelPrivate::slotRowsAboutToBeInserted),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::rowsAboutToBeRemoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotRowsAboutToBeRemoved),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::rowsMoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotRowsMoved),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::rowsAboutToBeMoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotRowsAboutToBeMoved),

        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::columnsInserted,
                                d, &QConcatenateTablesProxyModelPrivate::slotColumnsInserted),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::columnsRemoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotColumnsRemoved),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::columnsAboutToBeInserted,
                                d, &QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeInserted),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::columnsAboutToBeRemoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeRemoved),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::columnsMoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotColumnsMoved),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::columnsAboutToBeMoved,
                                d, &QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeMoved),

        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::layoutAboutToBeChanged,
                                d, &QConcatenateTablesProxyModelPrivate::slotSourceLayoutAboutToBeChanged),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::layoutChanged,
                                d, &QConcatenateTablesProxyModelPrivate::slotSourceLayoutChanged),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::modelAboutToBeReset,
                                d, &QConcatenateTablesProxyModelPrivate::slotModelAboutToBeReset),
        QObjectPrivate::connect(sourceModel, &QAbstractItemModel::modelReset,
                                d, &QConcatenateTablesProxyModelPrivate::slotModelReset),
    });
    if (!d->m_roleNamesDirty) {
        // do update immediately, since append() is a simple update:
        const auto newRoleNames = sourceModel->roleNames();
        for (const auto &[k, v] : newRoleNames.asKeyValueRange())
            d->m_roleNames.insert_or_assign(k, v);
    }
    if (newRows > 0)
        endInsertRows();

    d->updateColumnCount();
}